

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotated_binary_text_gen.cpp
# Opt level: O3

string * flatbuffers::anon_unknown_7::ToValueString<int>
                   (string *__return_storage_ptr__,BinaryRegion *region,uint8_t *binary)

{
  uint uVar1;
  string *psVar2;
  uint uVar3;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar4;
  uint __val;
  byte *pbVar5;
  ulong uVar6;
  uint uVar7;
  string __str;
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  ulong local_38;
  
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar4 = (ulong)*(uint *)(binary + region->offset);
  local_38 = uVar4;
  if (region->length != 0) {
    pbVar5 = binary + region->length + region->offset;
    uVar6 = 0;
    do {
      pbVar5 = pbVar5 + -1;
      ToHex_abi_cxx11_(&local_60,(flatbuffers *)(ulong)*pbVar5,(uint8_t)uVar4);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
      uVar4 = extraout_RDX;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        uVar4 = extraout_RDX_00;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < region->length);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  uVar7 = (uint)local_38;
  __val = -uVar7;
  if (0 < (int)uVar7) {
    __val = uVar7;
  }
  uVar7 = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar1 = 4;
    do {
      uVar7 = uVar1;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        uVar7 = uVar7 - 2;
        goto LAB_0031af73;
      }
      if (uVar3 < 1000) {
        uVar7 = uVar7 - 1;
        goto LAB_0031af73;
      }
      if (uVar3 < 10000) goto LAB_0031af73;
      uVar4 = uVar4 / 10000;
      uVar1 = uVar7 + 4;
    } while (99999 < uVar3);
    uVar7 = uVar7 + 1;
  }
LAB_0031af73:
  uVar4 = local_38 >> 0x1f & 1;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)uVar7 + (char)uVar4);
  std::__detail::__to_chars_10_impl<unsigned_int>(local_60._M_dataplus._M_p + uVar4,uVar7,__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  return psVar2;
}

Assistant:

std::string ToValueString(const BinaryRegion &region, const uint8_t *binary) {
  std::string s;
  s += "0x";
  const T val = ReadScalar<T>(binary + region.offset);
  const uint64_t start_index = region.offset + region.length - 1;
  for (uint64_t i = 0; i < region.length; ++i) {
    s += ToHex(binary[start_index - i]);
  }
  s += " (";
  s += ToString(val);
  s += ")";
  return s;
}